

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBMultiplyRow_C(uint8_t *src_argb0,uint8_t *src_argb1,uint8_t *dst_argb,int width)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  uint32_t a_scale;
  uint32_t r_scale;
  uint32_t g_scale;
  uint32_t b_scale;
  uint32_t a;
  uint32_t r;
  uint32_t g;
  uint32_t b;
  int i;
  int width_local;
  uint8_t *dst_argb_local;
  uint8_t *src_argb1_local;
  uint8_t *src_argb0_local;
  
  dst_argb_local = dst_argb;
  src_argb1_local = src_argb1;
  src_argb0_local = src_argb0;
  for (i = 0; i < width; i = i + 1) {
    uVar1 = src_argb0_local[1];
    uVar2 = src_argb0_local[1];
    uVar3 = src_argb0_local[2];
    uVar4 = src_argb0_local[2];
    uVar5 = src_argb0_local[3];
    uVar6 = src_argb0_local[3];
    bVar7 = src_argb1_local[1];
    bVar8 = src_argb1_local[2];
    bVar9 = src_argb1_local[3];
    *dst_argb_local =
         (uint8_t)((uint)*src_argb1_local * (uint)CONCAT11(*src_argb0_local,*src_argb0_local) >>
                  0x10);
    dst_argb_local[1] = (uint8_t)((uint)bVar7 * (uint)CONCAT11(uVar2,uVar1) >> 0x10);
    dst_argb_local[2] = (uint8_t)((uint)bVar8 * (uint)CONCAT11(uVar4,uVar3) >> 0x10);
    dst_argb_local[3] = (uint8_t)((uint)bVar9 * (uint)CONCAT11(uVar6,uVar5) >> 0x10);
    src_argb0_local = src_argb0_local + 4;
    src_argb1_local = src_argb1_local + 4;
    dst_argb_local = dst_argb_local + 4;
  }
  return;
}

Assistant:

void ARGBMultiplyRow_C(const uint8_t* src_argb0,
                       const uint8_t* src_argb1,
                       uint8_t* dst_argb,
                       int width) {
  int i;
  for (i = 0; i < width; ++i) {
    const uint32_t b = REPEAT8(src_argb0[0]);
    const uint32_t g = REPEAT8(src_argb0[1]);
    const uint32_t r = REPEAT8(src_argb0[2]);
    const uint32_t a = REPEAT8(src_argb0[3]);
    const uint32_t b_scale = src_argb1[0];
    const uint32_t g_scale = src_argb1[1];
    const uint32_t r_scale = src_argb1[2];
    const uint32_t a_scale = src_argb1[3];
    dst_argb[0] = SHADE(b, b_scale);
    dst_argb[1] = SHADE(g, g_scale);
    dst_argb[2] = SHADE(r, r_scale);
    dst_argb[3] = SHADE(a, a_scale);
    src_argb0 += 4;
    src_argb1 += 4;
    dst_argb += 4;
  }
}